

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colAlloc.c
# Opt level: O0

void PoolFreeEmptyPages(MemoryPool *pool)

{
  int iVar1;
  void *pvVar2;
  ulong uVar3;
  size_t sVar4;
  Page *pacVar5;
  Page *page_00;
  ulong local_58;
  size_t i;
  size_t nbPages;
  size_t nbSetCells;
  size_t nbPagesPerSysPage;
  Page *next;
  Page *prev;
  Page *base;
  Page *page;
  ThreadData *data;
  MemoryPool *pool_local;
  
  pvVar2 = pthread_getspecific(tsdKey);
  uVar3 = systemPageSize >> 0xc;
  pool->nbPages = 0;
  pool->nbSetCells = 0;
  next = (Page *)0x0;
  prev = pool->pages;
  while (prev != (Page *)0x0) {
    i = 0;
    nbPages = 0;
    base = prev;
    while( true ) {
      local_58 = i + 1;
      sVar4 = NbSetCells(base);
      nbPages = sVar4 + nbPages;
      i = local_58;
      if ((*(ulong *)*base & 0x20) != 0) break;
      base = (Page *)(*(ulong *)*base & 0xffffffffffffff00);
    }
    pacVar5 = (Page *)(*(ulong *)*base & 0xffffffffffffff00);
    if (local_58 < nbPages) {
      iVar1 = TestCell(base,0x7f);
      if ((iVar1 == 0) && (SysPageTrim(prev), local_58 < uVar3)) {
        *(ulong *)*base = *(ulong *)*base & 0xffffffffffffffdf;
        for (; local_58 < uVar3; local_58 = local_58 + 1) {
          *(ulong *)*base = *(ulong *)*base & 0xff;
          *(ulong *)*base = (ulong)(base + 1) & 0xffffffffffffff00 | *(ulong *)*base;
          page_00 = base + 1;
          *(ulong *)*page_00 = *(ulong *)*page_00 & 0xfffffffffffffff0;
          *(ulong *)*page_00 = (ulong)(pool->generation & 0xf) | *(ulong *)*page_00;
          *(ulong *)*page_00 = *(ulong *)*page_00 & 0xffffffffffffff0f;
          *(undefined8 *)(base[1] + 8) = *(undefined8 *)((long)pvVar2 + 8);
          ClearAllCells(page_00);
          i = i + 1;
          nbPages = nbPages + 1;
          base = page_00;
        }
        *(ulong *)*base = *(ulong *)*base | 0x20;
        *(ulong *)*base = *(ulong *)*base & 0xff;
        *(ulong *)*base = (ulong)pacVar5 | *(ulong *)*base;
      }
      next = base;
      pool->nbPages = i + pool->nbPages;
      pool->nbSetCells = nbPages + pool->nbSetCells;
      prev = pacVar5;
    }
    else {
      if (next == (Page *)0x0) {
        pool->pages = pacVar5;
      }
      else {
        *(ulong *)*next = *(ulong *)*next & 0xff;
        *(ulong *)*next = (ulong)pacVar5 | *(ulong *)*next;
      }
      SysPageFree(prev);
      prev = pacVar5;
    }
  }
  pool->lastPage = next;
  return;
}

Assistant:

void
PoolFreeEmptyPages(
    MemoryPool *pool)   /*!< Pool with pages to free. */
{
    ThreadData *data = PlatGetThreadData();
    Page *page, *base, *prev, *next;
    const size_t nbPagesPerSysPage = systemPageSize/PAGE_SIZE;
    size_t nbSetCells, nbPages, i;

    pool->nbPages = 0;
    pool->nbSetCells = 0;

    /*
     * Iterate over system pages...
     */

    for (prev = NULL, base = pool->pages; base; base = next) {
        /*
         * ... then over logical pages within the system page.
         */

        nbPages = 0;
        nbSetCells = 0;
        ASSERT(PAGE_FLAG(base, PAGE_FLAG_FIRST));
        for (page = base; ; page = PAGE_NEXT(page)) {
            nbPages++;
            nbSetCells += NbSetCells(page);
            if (PAGE_FLAG(page, PAGE_FLAG_LAST)) break;
        }
        next = PAGE_NEXT(page);
        if (nbSetCells > RESERVED_CELLS * nbPages) {
            /*
             * At least one page contains allocated cells.
             */

            if (!TestCell(page, CELLS_PER_PAGE-1)) {
                /*
                 * If there was a trailing large cell group, it is unused now.
                 */

                SysPageTrim(base);

                if (nbPages < nbPagesPerSysPage) {
                    /*
                     * Rebuild & relink logical pages that were used by the
                     * trailing cells.
                     */

                    PAGE_CLEAR_FLAG(page, PAGE_FLAG_LAST);
                    for (i = nbPages; i < nbPagesPerSysPage; i++) {
                        PAGE_SET_NEXT(page, page+1);
                        page++;

                        PAGE_SET_GENERATION(page, pool->generation);
                        PAGE_CLEAR_FLAG(page, PAGE_FLAGS_MASK);
                        PAGE_GROUPDATA(page) = data->groupData;

                        /* Initialize bit mask for allocated cells. */
                        ClearAllCells(page);

                        nbPages++;
                        nbSetCells++;
                    }
                    PAGE_SET_FLAG(page, PAGE_FLAG_LAST);
                    PAGE_SET_NEXT(page, next);
                }
            }
            prev = page;
            pool->nbPages += nbPages;
            pool->nbSetCells += nbSetCells;
        } else {
            /*
             * All logical pages in system page are empty.
             */

            if (prev) {
                /*
                 * Middle of list.
                 */

                PAGE_SET_NEXT(prev, next);
            } else {
                /*
                 * Head of list.
                 */

                pool->pages = next;
            }

            /*
             * Free the system page.
             */

            SysPageFree(base);
        }
    }
    ASSERT(!prev||!PAGE_NEXT(prev));
    pool->lastPage = prev;
}